

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Handler.cpp
# Opt level: O0

bool __thiscall
Handler::SortDeployedVM::anon_class_8_1_8991fb9c::operator()
          (anon_class_8_1_8991fb9c *this,uint32_t *a,uint32_t *b)

{
  long lVar1;
  reference pvVar2;
  reference pvVar3;
  reference pvVar4;
  reference pvVar5;
  uint *in_RDX;
  uint *in_RSI;
  long *in_RDI;
  VirtualMachine *vm2;
  VirtualMachine *vm1;
  DeployedVirtualMachine *deployedVM2;
  DeployedVirtualMachine *deployedVM1;
  bool local_1;
  
  lVar1 = *in_RDI;
  pvVar2 = std::vector<DeployedVirtualMachine,_std::allocator<DeployedVirtualMachine>_>::operator[]
                     ((vector<DeployedVirtualMachine,_std::allocator<DeployedVirtualMachine>_> *)
                      (lVar1 + 0x669f0),(ulong)*in_RSI);
  pvVar3 = std::vector<DeployedVirtualMachine,_std::allocator<DeployedVirtualMachine>_>::operator[]
                     ((vector<DeployedVirtualMachine,_std::allocator<DeployedVirtualMachine>_> *)
                      (lVar1 + 0x669f0),(ulong)*in_RDX);
  pvVar4 = std::vector<VirtualMachine,_std::allocator<VirtualMachine>_>::operator[]
                     ((vector<VirtualMachine,_std::allocator<VirtualMachine>_> *)(lVar1 + 0x48),
                      (ulong)pvVar2->vmIdx);
  pvVar5 = std::vector<VirtualMachine,_std::allocator<VirtualMachine>_>::operator[]
                     ((vector<VirtualMachine,_std::allocator<VirtualMachine>_> *)(lVar1 + 0x48),
                      (ulong)pvVar3->vmIdx);
  if (((pvVar2->location & 1U) == 0) || ((pvVar3->location & 1U) != 0)) {
    if (((pvVar2->location & 1U) == 0) && ((pvVar3->location & 1U) != 0)) {
      local_1 = false;
    }
    else {
      local_1 = (uint)pvVar5->cpuCore + (uint)pvVar5->memorySize <
                (uint)pvVar4->cpuCore + (uint)pvVar4->memorySize;
    }
  }
  else {
    local_1 = true;
  }
  return local_1;
}

Assistant:

void Handler::SortDeployedVM(std::vector<uint32_t> &deployedVMIndexes) {
    std::sort(deployedVMIndexes.begin(), deployedVMIndexes.end(), [this](const uint32_t &a, const uint32_t &b) {
        const DeployedVirtualMachine &deployedVM1 = deployedVMs[a];
        const DeployedVirtualMachine &deployedVM2 = deployedVMs[b];
        const VirtualMachine &vm1 = virtualMachines[deployedVM1.vmIdx];
        const VirtualMachine &vm2 = virtualMachines[deployedVM2.vmIdx];

        if (deployedVM1.location && !deployedVM2.location) return true;
        else if (!deployedVM1.location && deployedVM2.location) return false;
        else return vm1.cpuCore + vm1.memorySize > vm2.cpuCore + vm2.memorySize;
    });
}